

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resCore.c
# Opt level: O1

void Res_UpdateNetwork(Abc_Obj_t *pObj,Vec_Ptr_t *vFanins,Hop_Obj_t *pFunc,Vec_Vec_t *vLevels)

{
  Abc_Obj_t *pObj_00;
  long lVar1;
  
  pObj_00 = Abc_NtkCreateObj(pObj->pNtk,ABC_OBJ_NODE);
  (pObj_00->field_5).pData = pFunc;
  if (0 < vFanins->nSize) {
    lVar1 = 0;
    do {
      Abc_ObjAddFanin(pObj_00,(Abc_Obj_t *)vFanins->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vFanins->nSize);
  }
  Abc_NtkUpdate(pObj,pObj_00,vLevels);
  return;
}

Assistant:

void Res_UpdateNetwork( Abc_Obj_t * pObj, Vec_Ptr_t * vFanins, Hop_Obj_t * pFunc, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pObjNew, * pFanin;
    int k;

    // create the new node
    pObjNew = Abc_NtkCreateNode( pObj->pNtk );
    pObjNew->pData = pFunc;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, k )
        Abc_ObjAddFanin( pObjNew, pFanin );
    // replace the old node by the new node
//printf( "Replacing node " ); Abc_ObjPrint( stdout, pObj );
//printf( "Inserting node " ); Abc_ObjPrint( stdout, pObjNew );
    // update the level of the node
    Abc_NtkUpdate( pObj, pObjNew, vLevels );
}